

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void * JHThread::Thread::start_thread(void *arg)

{
  pthread_setspecific(mThreadKey,arg);
  (**(code **)(*arg + 0x20))(arg);
  (**(code **)(*arg + 0x10))(arg);
  return (void *)0x0;
}

Assistant:

void *Thread::start_thread( void *arg )
{
	Thread *thread = (Thread*)arg;

	pthread_setspecific( mThreadKey, thread );

	TRACE_BEGIN( LOG_LVL_INFO );
	
	// The cancel type was set to async to support hard_stop. No longer need 
	//  and causes problems.
	//pthread_setcanceltype( PTHREAD_CANCEL_ASYNCHRONOUS, NULL );	
	
	LOG( "started pid %d tid %d", getpid(), (long)pthread_self() ); 
	thread->OnStartThread();
	thread->OnStart();
	
	return NULL;
}